

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4x4.cpp
# Opt level: O1

Matrix4x4 * CMU462::operator*(Matrix4x4 *__return_storage_ptr__,double c,Matrix4x4 *A)

{
  Matrix4x4 *cA;
  
  __return_storage_ptr__->entries[3].z = 0.0;
  __return_storage_ptr__->entries[3].w = 0.0;
  __return_storage_ptr__->entries[3].x = 0.0;
  __return_storage_ptr__->entries[3].y = 0.0;
  __return_storage_ptr__->entries[2].z = 0.0;
  __return_storage_ptr__->entries[2].w = 0.0;
  __return_storage_ptr__->entries[2].x = 0.0;
  __return_storage_ptr__->entries[2].y = 0.0;
  __return_storage_ptr__->entries[1].z = 0.0;
  __return_storage_ptr__->entries[1].w = 0.0;
  __return_storage_ptr__->entries[1].x = 0.0;
  __return_storage_ptr__->entries[1].y = 0.0;
  __return_storage_ptr__->entries[0].z = 0.0;
  __return_storage_ptr__->entries[0].w = 0.0;
  __return_storage_ptr__->entries[0].x = 0.0;
  __return_storage_ptr__->entries[0].y = 0.0;
  __return_storage_ptr__->entries[0].x = A->entries[0].x * c;
  __return_storage_ptr__->entries[0].y = A->entries[0].y * c;
  __return_storage_ptr__->entries[0].z = A->entries[0].z * c;
  __return_storage_ptr__->entries[0].w = A->entries[0].w * c;
  __return_storage_ptr__->entries[1].x = A->entries[1].x * c;
  __return_storage_ptr__->entries[1].y = A->entries[1].y * c;
  __return_storage_ptr__->entries[1].z = A->entries[1].z * c;
  __return_storage_ptr__->entries[1].w = A->entries[1].w * c;
  __return_storage_ptr__->entries[2].x = A->entries[2].x * c;
  __return_storage_ptr__->entries[2].y = A->entries[2].y * c;
  __return_storage_ptr__->entries[2].z = A->entries[2].z * c;
  __return_storage_ptr__->entries[2].w = A->entries[2].w * c;
  __return_storage_ptr__->entries[3].x = A->entries[3].x * c;
  __return_storage_ptr__->entries[3].y = A->entries[3].y * c;
  __return_storage_ptr__->entries[3].z = A->entries[3].z * c;
  __return_storage_ptr__->entries[3].w = c * A->entries[3].w;
  return __return_storage_ptr__;
}

Assistant:

Matrix4x4 operator*( double c, const Matrix4x4& A ) {

    Matrix4x4 cA;
    const double* Aij = (const double*) &A;
    double* cAij = (double*) &cA;

    *cAij++ = c * (*Aij++);//0
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);//4
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);//8
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);//12
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);//15
	//16
    return cA;
  }